

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O0

void cm_zlib_inflate_fast(z_streamp strm,uint start)

{
  uInt uVar1;
  uint uVar2;
  uint uVar3;
  uInt uVar4;
  uInt uVar5;
  internal_state_conflict1 *piVar6;
  long lVar7;
  Posf *pPVar8;
  Posf *pPVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  Bytef *pBVar15;
  Bytef *pBVar16;
  Bytef *pBVar17;
  uchar *puVar18;
  uInt local_c8;
  uInt local_c0;
  long local_a0;
  uchar *from;
  uint dist;
  uint len;
  uint op;
  code this;
  uint dmask;
  uint lmask;
  code *dcode;
  code *lcode;
  ulong uStack_68;
  uint bits;
  unsigned_long hold;
  uchar *window;
  uint write;
  uint whave;
  uint wsize;
  uchar *end;
  uchar *beg;
  uchar *out;
  uchar *last;
  uchar *in;
  inflate_state *state;
  uint start_local;
  z_streamp strm_local;
  
  piVar6 = strm->state;
  last = strm->next_in + -1;
  pBVar15 = last + (strm->avail_in - 5);
  beg = strm->next_out + -1;
  uVar1 = strm->avail_out;
  iVar10 = (int)beg;
  pBVar16 = beg + (strm->avail_out - 0x101);
  iVar14 = *(int *)((long)&piVar6->gzhead + 4);
  uVar2 = piVar6->gzindex;
  uVar3 = *(uint *)&piVar6->method;
  lVar7 = *(long *)&piVar6->last_flush;
  uStack_68._0_4_ = piVar6->w_bits;
  uStack_68._4_4_ = piVar6->w_mask;
  lcode._4_4_ = *(uint *)&piVar6->window;
  pPVar8 = piVar6->prev;
  pPVar9 = piVar6->head;
  uVar4 = piVar6->ins_h;
  uVar5 = piVar6->hash_size;
LAB_0084ada9:
  if (lcode._4_4_ < 0xf) {
    uStack_68 = ((ulong)last[2] << ((byte)lcode._4_4_ + 8 & 0x3f)) +
                ((ulong)last[1] << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
    lcode._4_4_ = lcode._4_4_ + 0x10;
    last = last + 2;
  }
  len = *(uint *)(pPVar8 + (uStack_68 & (1 << ((byte)uVar4 & 0x1f)) - 1) * 2);
  while( true ) {
    uStack_68 = uStack_68 >> (len._1_1_ & 0x3f);
    lcode._4_4_ = lcode._4_4_ - len._1_1_;
    if ((len & 0xff) == 0) break;
    if ((len & 0x10) != 0) {
      from._4_4_ = (uint)len._2_2_;
      uVar12 = len & 0xf;
      if (uVar12 != 0) {
        if (lcode._4_4_ < uVar12) {
          uStack_68 = ((ulong)last[1] << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
          lcode._4_4_ = lcode._4_4_ + 8;
          last = last + 1;
        }
        from._4_4_ = ((uint)uStack_68 & (1 << (sbyte)uVar12) - 1U) + from._4_4_;
        uStack_68 = uStack_68 >> (sbyte)uVar12;
        lcode._4_4_ = lcode._4_4_ - uVar12;
      }
      if (lcode._4_4_ < 0xf) {
        uStack_68 = ((ulong)last[2] << ((byte)lcode._4_4_ + 8 & 0x3f)) +
                    ((ulong)last[1] << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
        lcode._4_4_ = lcode._4_4_ + 0x10;
        last = last + 2;
      }
      len = *(uint *)(pPVar9 + (uStack_68 & (1 << ((byte)uVar5 & 0x1f)) - 1) * 2);
      goto LAB_0084afa0;
    }
    if ((len & 0x40) != 0) {
      if ((len & 0x20) == 0) {
        strm->msg = "invalid literal/length code";
        *(undefined4 *)&piVar6->strm = 0x1b;
      }
      else {
        *(undefined4 *)&piVar6->strm = 0xb;
      }
      goto LAB_0084b700;
    }
    len = *(uint *)(pPVar8 + ((ulong)len._2_2_ + (uStack_68 & (1 << ((byte)len & 0x1f)) - 1)) * 2);
  }
  beg[1] = (uchar)(len >> 0x10);
  puVar18 = beg + 1;
  goto LAB_0084b6cd;
LAB_0084afa0:
  uStack_68 = uStack_68 >> (len._1_1_ & 0x3f);
  uVar12 = lcode._4_4_ - len._1_1_;
  lcode._4_4_ = uVar12;
  if ((len & 0x10) != 0) goto code_r0x0084afed;
  if ((len & 0x40) != 0) {
    strm->msg = "invalid distance code";
    *(undefined4 *)&piVar6->strm = 0x1b;
    goto LAB_0084b700;
  }
  len = *(uint *)(pPVar9 + ((ulong)len._2_2_ + (uStack_68 & (1 << ((byte)len & 0x1f)) - 1)) * 2);
  goto LAB_0084afa0;
code_r0x0084afed:
  uVar13 = len & 0xf;
  puVar18 = last;
  if (uVar12 < uVar13) {
    uStack_68 = ((ulong)last[1] << ((byte)uVar12 & 0x3f)) + uStack_68;
    lcode._4_4_ = uVar12 + 8;
    puVar18 = last + 1;
    if (lcode._4_4_ < uVar13) {
      uStack_68 = ((ulong)last[2] << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
      lcode._4_4_ = uVar12 + 0x10;
      puVar18 = last + 2;
    }
  }
  last = puVar18;
  uVar12 = ((uint)uStack_68 & (1 << (sbyte)uVar13) - 1U) + (uint)len._2_2_;
  uStack_68 = uStack_68 >> (sbyte)uVar13;
  lcode._4_4_ = lcode._4_4_ - uVar13;
  uVar13 = (int)beg - (iVar10 - (start - uVar1));
  if (uVar13 < uVar12) {
    dist = uVar12 - uVar13;
    if (uVar2 < dist) {
      strm->msg = "invalid distance too far back";
      *(undefined4 *)&piVar6->strm = 0x1b;
      goto LAB_0084b700;
    }
    local_a0 = lVar7 + -1;
    if (uVar3 == 0) {
      local_a0 = local_a0 + (ulong)(iVar14 - dist);
      if (dist < from._4_4_) {
        from._4_4_ = from._4_4_ - dist;
        do {
          puVar18 = beg + 1;
          beg[1] = *(uchar *)(local_a0 + 1);
          dist = dist - 1;
          local_a0 = local_a0 + 1;
          beg = puVar18;
        } while (dist != 0);
        local_a0 = (long)puVar18 - (ulong)uVar12;
      }
    }
    else if (uVar3 < dist) {
      local_a0 = local_a0 + (ulong)((iVar14 + uVar3) - dist);
      dist = dist - uVar3;
      if (dist < from._4_4_) {
        from._4_4_ = from._4_4_ - dist;
        do {
          puVar18 = beg + 1;
          beg[1] = *(uchar *)(local_a0 + 1);
          dist = dist - 1;
          local_a0 = local_a0 + 1;
          beg = puVar18;
        } while (dist != 0);
        local_a0 = lVar7 + -1;
        if (uVar3 < from._4_4_) {
          from._4_4_ = from._4_4_ - uVar3;
          dist = uVar3;
          do {
            puVar18 = beg + 1;
            beg[1] = *(uchar *)(local_a0 + 1);
            dist = dist - 1;
            local_a0 = local_a0 + 1;
            beg = puVar18;
          } while (dist != 0);
          local_a0 = (long)puVar18 - (ulong)uVar12;
        }
      }
    }
    else {
      local_a0 = local_a0 + (ulong)(uVar3 - dist);
      if (dist < from._4_4_) {
        from._4_4_ = from._4_4_ - dist;
        do {
          puVar18 = beg + 1;
          beg[1] = *(uchar *)(local_a0 + 1);
          dist = dist - 1;
          local_a0 = local_a0 + 1;
          beg = puVar18;
        } while (dist != 0);
        local_a0 = (long)puVar18 - (ulong)uVar12;
      }
    }
    for (; 2 < from._4_4_; from._4_4_ = from._4_4_ - 3) {
      beg[1] = *(uchar *)(local_a0 + 1);
      beg[2] = *(uchar *)(local_a0 + 2);
      beg[3] = *(uchar *)(local_a0 + 3);
      local_a0 = local_a0 + 3;
      beg = beg + 3;
    }
    puVar18 = beg;
    if (from._4_4_ != 0) {
      beg[1] = *(uchar *)(local_a0 + 1);
      puVar18 = beg + 1;
      if (1 < from._4_4_) {
        beg[2] = *(uchar *)(local_a0 + 2);
        puVar18 = beg + 2;
      }
    }
  }
  else {
    lVar11 = (long)beg - (ulong)uVar12;
    puVar18 = beg;
    do {
      beg = puVar18;
      local_a0 = lVar11;
      beg[1] = *(uchar *)(local_a0 + 1);
      beg[2] = *(uchar *)(local_a0 + 2);
      beg[3] = *(uchar *)(local_a0 + 3);
      from._4_4_ = from._4_4_ - 3;
      lVar11 = local_a0 + 3;
      puVar18 = beg + 3;
    } while (2 < from._4_4_);
    if (from._4_4_ != 0) {
      beg[4] = *(uchar *)(local_a0 + 4);
      puVar18 = beg + 4;
      if (1 < from._4_4_) {
        beg[5] = *(uchar *)(local_a0 + 5);
        puVar18 = beg + 5;
      }
    }
  }
LAB_0084b6cd:
  beg = puVar18;
  if (pBVar15 <= last || pBVar16 <= beg) {
LAB_0084b700:
    pBVar17 = last + -(ulong)(lcode._4_4_ >> 3);
    iVar14 = lcode._4_4_ + (lcode._4_4_ >> 3) * -8;
    uStack_68 = (1 << ((byte)iVar14 & 0x1f)) - 1 & uStack_68;
    strm->next_in = pBVar17 + 1;
    strm->next_out = beg + 1;
    if (pBVar17 < pBVar15) {
      iVar10 = (int)pBVar15 - (int)pBVar17;
    }
    else {
      iVar10 = -((int)pBVar17 - (int)pBVar15);
    }
    local_c0 = iVar10 + 5;
    strm->avail_in = local_c0;
    if (beg < pBVar16) {
      iVar10 = (int)pBVar16 - (int)beg;
    }
    else {
      iVar10 = -((int)beg - (int)pBVar16);
    }
    local_c8 = iVar10 + 0x101;
    strm->avail_out = local_c8;
    piVar6->w_bits = (int)uStack_68;
    piVar6->w_mask = (int)(uStack_68 >> 0x20);
    *(int *)&piVar6->window = iVar14;
    return;
  }
  goto LAB_0084ada9;
}

Assistant:

void inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned write;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code this;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    write = state->write;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
        }
        this = lcode[hold & lmask];
      dolen:
        op = (unsigned)(this.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(this.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, this.val >= 0x20 && this.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", this.val));
            PUP(out) = (unsigned char)(this.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(this.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
            }
            this = dcode[hold & dmask];
          dodist:
            op = (unsigned)(this.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(this.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(this.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        strm->msg = (char *)"invalid distance too far back";
                        state->mode = BAD;
                        break;
                    }
                    from = window - OFF;
                    if (write == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (write < op) {      /* wrap around window */
                        from += wsize + write - op;
                        op -= write;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (write < len) {  /* some from start of window */
                                op = write;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += write - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                this = dcode[this.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            this = lcode[this.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}